

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffbnfm(char *tform,int *dtcode,long *trepeat,long *twidth,int *status)

{
  int iVar1;
  ushort **ppuVar2;
  long *in_RCX;
  long *in_RDX;
  int *in_RSI;
  char *in_RDI;
  int *in_R8;
  char message [81];
  char temp [71];
  char *form;
  long repeat;
  long width;
  int iread;
  int variable;
  int datacode;
  size_t nchar;
  size_t ii;
  char acStack_118 [8];
  char *in_stack_fffffffffffffef0;
  char local_b8 [80];
  char *local_68;
  long local_60;
  long local_58;
  int local_4c;
  int local_48;
  int local_44;
  size_t local_40;
  ulong local_38;
  int *local_30;
  long *local_28;
  long *local_20;
  int *local_18;
  char *local_10;
  int local_4;
  
  if (*in_R8 < 1) {
    if (in_RSI != (int *)0x0) {
      *in_RSI = 0;
    }
    if (in_RDX != (long *)0x0) {
      *in_RDX = 0;
    }
    if (in_RCX != (long *)0x0) {
      *in_RCX = 0;
    }
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_40 = strlen(in_RDI);
    for (local_38 = 0; (local_38 < local_40 && (local_10[local_38] == ' ')); local_38 = local_38 + 1
        ) {
    }
    if (local_38 == local_40) {
      ffpmsg((char *)0x16b1c3);
      *local_30 = 0x105;
      local_4 = 0x105;
    }
    else if (local_40 - local_38 < 0x47) {
      strcpy(local_b8,local_10 + local_38);
      ffupch(in_stack_fffffffffffffef0);
      local_68 = local_b8;
      local_38 = 0;
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)local_68[local_38]] & 0x800) != 0) {
        local_38 = local_38 + 1;
      }
      if (local_38 == 0) {
        local_60 = 1;
      }
      else {
        iVar1 = __isoc99_sscanf(local_68,"%ld",&local_60);
        if (iVar1 != 1) {
          ffpmsg((char *)0x16b2e9);
          *local_30 = 0x105;
          return 0x105;
        }
      }
      local_68 = local_68 + local_38;
      if ((*local_68 == 'P') || (*local_68 == 'Q')) {
        local_48 = 1;
        local_68 = local_68 + 1;
      }
      else {
        local_48 = 0;
      }
      if (*local_68 == 'U') {
        local_44 = 0x14;
        local_58 = 2;
      }
      else if (*local_68 == 'I') {
        local_44 = 0x15;
        local_58 = 2;
      }
      else if (*local_68 == 'V') {
        local_44 = 0x28;
        local_58 = 4;
      }
      else if (*local_68 == 'W') {
        local_44 = 0x50;
        local_58 = 8;
      }
      else if (*local_68 == 'J') {
        local_44 = 0x29;
        local_58 = 4;
      }
      else if (*local_68 == 'K') {
        local_44 = 0x51;
        local_58 = 8;
      }
      else if (*local_68 == 'E') {
        local_44 = 0x2a;
        local_58 = 4;
      }
      else if (*local_68 == 'D') {
        local_44 = 0x52;
        local_58 = 8;
      }
      else if (*local_68 == 'A') {
        local_44 = 0x10;
        local_4c = 0;
        if (local_68[1] != '\0') {
          if (local_68[1] == '(') {
            local_68 = local_68 + 1;
          }
          local_4c = __isoc99_sscanf(local_68 + 1,"%ld",&local_58);
        }
        if ((local_4c != 1) || ((local_48 == 0 && (local_60 < local_58)))) {
          local_58 = local_60;
        }
      }
      else if (*local_68 == 'L') {
        local_44 = 0xe;
        local_58 = 1;
      }
      else if (*local_68 == 'X') {
        local_44 = 1;
        local_58 = 1;
      }
      else if (*local_68 == 'B') {
        local_44 = 0xb;
        local_58 = 1;
      }
      else if (*local_68 == 'S') {
        local_44 = 0xc;
        local_58 = 1;
      }
      else if (*local_68 == 'C') {
        local_44 = 0x53;
        local_58 = 8;
      }
      else {
        if (*local_68 != 'M') {
          snprintf(acStack_118,0x51,"Illegal binary table TFORMn datatype: \'%s\' ",local_10);
          ffpmsg((char *)0x16b6b9);
          *local_30 = 0x106;
          return 0x106;
        }
        local_44 = 0xa3;
        local_58 = 0x10;
      }
      if (local_48 != 0) {
        local_44 = -local_44;
      }
      if (local_18 != (int *)0x0) {
        *local_18 = local_44;
      }
      if (local_20 != (long *)0x0) {
        *local_20 = local_60;
      }
      if (local_28 != (long *)0x0) {
        *local_28 = local_58;
      }
      local_4 = *local_30;
    }
    else {
      ffpmsg((char *)0x16b203);
      *local_30 = 0x105;
      local_4 = 0x105;
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffbnfm(char *tform,     /* I - format code from the TFORMn keyword */
           int *dtcode,   /* O - numerical datatype code */
           long *trepeat,    /* O - repeat count of the field  */
           long *twidth,     /* O - width of the field, in chars */
           int *status)     /* IO - error status      */
{
/*
  parse the binary table TFORM column format to determine the data
  type, repeat count, and the field width (if it is an ASCII (A) field)
*/
    size_t ii, nchar;
    int datacode, variable, iread;
    long width, repeat;
    char *form, temp[FLEN_VALUE], message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    if (dtcode)
        *dtcode = 0;

    if (trepeat)
        *trepeat = 0;

    if (twidth)
        *twidth = 0;

    nchar = strlen(tform);

    for (ii = 0; ii < nchar; ii++)
    {
        if (tform[ii] != ' ')     /* find first non-space char */
            break;
    }

    if (ii == nchar)
    {
        ffpmsg("Error: binary table TFORM code is blank (ffbnfm).");
        return(*status = BAD_TFORM);
    }

    if (nchar-ii > FLEN_VALUE-1)
    {
        ffpmsg("Error: binary table TFORM code is too long (ffbnfm).");
        return (*status = BAD_TFORM);
    }
    strcpy(temp, &tform[ii]); /* copy format string */
    ffupch(temp);     /* make sure it is in upper case */
    form = temp;      /* point to start of format string */

    /*-----------------------------------------------*/
    /*       get the repeat count                    */
    /*-----------------------------------------------*/

    ii = 0;
    while(isdigit((int) form[ii]))
        ii++;   /* look for leading digits in the field */

    if (ii == 0)
        repeat = 1;  /* no explicit repeat count */
    else
    {
        if (sscanf(form,"%ld", &repeat) != 1) /* read repeat count */
        {
           ffpmsg("Error: Bad repeat format in TFORM (ffbnfm).");
           return(*status = BAD_TFORM);
        }  
    }

    /*-----------------------------------------------*/
    /*             determine datatype code           */
    /*-----------------------------------------------*/

    form = form + ii;  /* skip over the repeat field */

    if (form[0] == 'P' || form[0] == 'Q')
    {
        variable = 1;  /* this is a variable length column */
/*        repeat = 1;  */ /* disregard any other repeat value */
        form++;        /* move to the next data type code char */
    }
    else
        variable = 0;

    if (form[0] == 'U')  /* internal code to signify unsigned short integer */
    { 
        datacode = TUSHORT;
        width = 2;
    }
    else if (form[0] == 'I')
    {
        datacode = TSHORT;
        width = 2;
    }
    else if (form[0] == 'V') /* internal code to signify unsigned integer */
    {
        datacode = TULONG;
        width = 4;
    }
    else if (form[0] == 'W') /* internal code to signify unsigned long long integer */
    {
        datacode = TULONGLONG;
        width = 8;
    }
    else if (form[0] == 'J')
    {
        datacode = TLONG;
        width = 4;
    }
    else if (form[0] == 'K')
    {
        datacode = TLONGLONG;
        width = 8;
    }
    else if (form[0] == 'E')
    {
        datacode = TFLOAT;
        width = 4;
    }
    else if (form[0] == 'D')
    {
        datacode = TDOUBLE;
        width = 8;
    }
    else if (form[0] == 'A')
    {
        datacode = TSTRING;

        /*
          the following code is used to support the non-standard
          datatype of the form rAw where r = total width of the field
          and w = width of fixed-length substrings within the field.
        */
        iread = 0;
        if (form[1] != 0)
        {
            if (form[1] == '(' )  /* skip parenthesis around */
                form++;          /* variable length column width */

            iread = sscanf(&form[1],"%ld", &width);
        }

        if (iread != 1 || (!variable && (width > repeat)) )
            width = repeat;
  
    }
    else if (form[0] == 'L')
    {
        datacode = TLOGICAL;
        width = 1;
    }
    else if (form[0] == 'X')
    {
        datacode = TBIT;
        width = 1;
    }
    else if (form[0] == 'B')
    {
        datacode = TBYTE;
        width = 1;
    }
    else if (form[0] == 'S') /* internal code to signify signed byte */
    {
        datacode = TSBYTE;
        width = 1;
    }
    else if (form[0] == 'C')
    {
        datacode = TCOMPLEX;
        width = 8;
    }
    else if (form[0] == 'M')
    {
        datacode = TDBLCOMPLEX;
        width = 16;
    }
    else
    {
        snprintf(message, FLEN_ERRMSG,
        "Illegal binary table TFORMn datatype: \'%s\' ", tform);
        ffpmsg(message);
        return(*status = BAD_TFORM_DTYPE);
    }

    if (variable)
        datacode = datacode * (-1); /* flag variable cols w/ neg type code */

    if (dtcode)
       *dtcode = datacode;

    if (trepeat)
       *trepeat = repeat;

    if (twidth)
       *twidth = width;

    return(*status);
}